

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

int unixpathname(char *src,char *dst,int versionp,int genp)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  __uid_t __uid;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  int *piVar8;
  passwd *ppVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  char *pcVar13;
  char ver2 [16];
  char ver1 [16];
  char name [64];
  char lfname [4096];
  char fbuf1 [4096];
  char fbuf2 [4096];
  
  if ((*src == '<') && (src[1] == '\0')) {
    dst[0] = '/';
    dst[1] = '\0';
    return 1;
  }
  strcpy(lfname,src);
  if (versionp != 0) {
    pcVar6 = lfname;
    pcVar7 = (char *)0x0;
    while( true ) {
      while (pcVar10 = pcVar6, cVar3 = *pcVar10, cVar3 == '\'') {
        if (pcVar10[1] == '\0') goto LAB_0012e173;
        pcVar6 = pcVar10 + 2;
      }
      if (cVar3 == '\0') break;
      if (cVar3 == ';') {
        pcVar6 = pcVar10 + 1;
        pcVar7 = pcVar10;
      }
      else {
LAB_0012e173:
        pcVar6 = pcVar10 + 1;
      }
    }
    if (pcVar7 != (char *)0x0) {
      cVar3 = pcVar7[1];
      if (cVar3 != '\0') {
        pcVar6 = pcVar7 + 2;
        while (cVar3 != '\0') {
          if ((byte)(cVar3 - 0x3aU) < 0xf6) {
            strcpy(fbuf1,pcVar7 + 1);
            sVar5 = strlen(fbuf1);
            (fbuf1 + sVar5)[0] = '~';
            (fbuf1 + sVar5)[1] = '\0';
            pcVar7[0] = '.';
            pcVar7[1] = '~';
            pcVar7[2] = '\0';
            goto LAB_0012e21a;
          }
          cVar3 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        }
        uVar4 = strtoul(pcVar7 + 1,(char **)0x0,10);
        if ((int)uVar4 != 0) {
          sprintf(fbuf1,".~%u~",uVar4 & 0xffffffff);
          *pcVar7 = '\0';
LAB_0012e21a:
          strcat(lfname,fbuf1);
          goto LAB_0012e227;
        }
      }
      *pcVar7 = '\0';
    }
  }
LAB_0012e227:
  if (lfname[0] == '~') {
    if ((lfname[1] == '\0') || (lfname[1] == '>')) {
      alarm(TIMEOUT_TIME);
      piVar8 = __errno_location();
      do {
        *piVar8 = 0;
        __uid = getuid();
        ppVar9 = getpwuid(__uid);
        if (ppVar9 != (passwd *)0x0) {
          alarm(0);
          strcpy(dst,ppVar9->pw_dir);
          pcVar6 = dst;
          do {
            pcVar7 = pcVar6;
            pcVar6 = pcVar7 + 1;
          } while (*pcVar7 != '\0');
          if (pcVar7[-1] != '/') {
            *pcVar7 = '/';
            pcVar7 = pcVar7 + 1;
          }
          pcVar6 = lfname + 1;
          if (lfname[1] != '\0') {
            pcVar6 = lfname + 2;
          }
          goto LAB_0012e450;
        }
      } while (*piVar8 == 4);
    }
    else {
      lVar11 = 0;
      while ((lfname[1] != '\0' && (lfname[1] != '>'))) {
        name[lVar11] = lfname[1];
        lVar2 = lVar11 + 2;
        lVar11 = lVar11 + 1;
        lfname[1] = lfname[lVar2];
      }
      name[lVar11] = '\0';
      alarm(TIMEOUT_TIME);
      piVar8 = __errno_location();
      do {
        *piVar8 = 0;
        ppVar9 = getpwnam(name);
        if (ppVar9 != (passwd *)0x0) {
          alarm(0);
          strcpy(dst,ppVar9->pw_dir);
          pcVar6 = dst;
          do {
            pcVar7 = pcVar6;
            pcVar6 = pcVar7 + 1;
          } while (*pcVar7 != '\0');
          if (pcVar7[-1] != '/') {
            *pcVar7 = '/';
            pcVar7 = pcVar7 + 1;
          }
          pcVar6 = lfname + 1 + (ulong)(lfname[lVar11 + 1] == '>') + lVar11;
          goto LAB_0012e450;
        }
      } while (*piVar8 == 4);
    }
    alarm(0);
    return 0;
  }
  if (lfname[0] == '.') {
    if (lfname[1] == '\0') {
      pcVar6 = getcwd(dst,0x1000);
      if (pcVar6 == (char *)0x0) {
        return 0;
      }
      pcVar7 = dst;
      do {
        pcVar6 = pcVar7;
        pcVar7 = pcVar6 + 1;
      } while (*pcVar6 != '\0');
      *pcVar6 = '/';
      pcVar6 = lfname + 1;
      goto LAB_0012e450;
    }
    if (lfname[1] == '>') {
      pcVar6 = getcwd(dst,0x1000);
      pcVar7 = dst;
      if (pcVar6 == (char *)0x0) {
        return 0;
      }
      do {
        pcVar6 = pcVar7;
        pcVar7 = pcVar6 + 1;
      } while (*pcVar6 != '\0');
      *pcVar6 = '/';
      pcVar6 = lfname + 2;
      goto LAB_0012e450;
    }
    if ((lfname[1] == '.') && ((lfname[2] == '>' || (lfname[2] == '\0')))) {
      pcVar6 = getcwd(dst,0x1000);
      if (pcVar6 == (char *)0x0) {
        return 0;
      }
      pcVar7 = strrchr(dst,0x2f);
      pcVar7 = pcVar7 + 1;
      pcVar6 = lfname + 3;
      if (lfname[2] == '\0') {
        pcVar6 = lfname + 2;
      }
      goto LAB_0012e450;
    }
  }
  pcVar7 = dst + 1;
  *dst = '/';
  pcVar6 = lfname;
LAB_0012e450:
  do {
    bVar12 = false;
    bVar1 = true;
LAB_0012e452:
    do {
      while( true ) {
        pcVar10 = pcVar6;
        cVar3 = *pcVar10;
        if (cVar3 == '\0') {
          *pcVar7 = '\0';
          if (bVar1 || genp != 0) {
            return 1;
          }
          strcpy(fbuf1,lfname);
          strcpy(fbuf2,dst);
          separate_version(fbuf1,ver1,1);
          separate_version(fbuf2,ver2,1);
          pcVar6 = lfname + 0xffc;
          do {
            pcVar10 = pcVar6;
            pcVar6 = pcVar10 + 1;
            pcVar7 = fbuf2;
          } while (pcVar10[4] != '\0');
          do {
            pcVar13 = pcVar7;
            pcVar7 = pcVar13 + 1;
          } while (*pcVar13 != '\0');
          if ((pcVar10[3] == '.') &&
             ((pcVar10[2] != '\'' || ((fbuf1 < pcVar6 && (*pcVar6 == '\'')))))) {
            pcVar13[-1] = '\0';
          }
          strcpy(dst,fbuf2);
          if (ver2[0] != '\0') {
            sVar5 = strlen(dst);
            (dst + sVar5)[0] = '.';
            (dst + sVar5)[1] = '~';
            dst[sVar5 + 2] = '\0';
            strcat(dst,ver2);
            sVar5 = strlen(dst);
            (dst + sVar5)[0] = '~';
            (dst + sVar5)[1] = '\0';
            return 1;
          }
          return 1;
        }
        if (!bVar12) break;
        if (cVar3 == '\'') {
LAB_0012e4cb:
          pcVar6 = pcVar10 + 2;
        }
        else {
          if (cVar3 == '>') {
            *pcVar7 = '/';
            pcVar7 = pcVar7 + 1;
            pcVar6 = pcVar10 + 1;
            goto LAB_0012e450;
          }
          pcVar6 = pcVar10 + 1;
          *pcVar7 = cVar3;
          pcVar7 = pcVar7 + 1;
        }
        bVar1 = false;
        bVar12 = true;
      }
      if (cVar3 == '\'') {
        *pcVar7 = pcVar10[1];
        pcVar7 = pcVar7 + 1;
        goto LAB_0012e4cb;
      }
      pcVar6 = pcVar10 + 1;
      if (cVar3 != '.') {
        *pcVar7 = cVar3;
LAB_0012e4e4:
        pcVar7 = pcVar7 + 1;
        bVar1 = false;
        bVar12 = true;
        goto LAB_0012e452;
      }
      cVar3 = *pcVar6;
      bVar12 = false;
      bVar1 = true;
      if (cVar3 == '\0') goto LAB_0012e452;
      if (cVar3 == '>') {
        pcVar6 = pcVar10 + 2;
        goto LAB_0012e450;
      }
      if (cVar3 != '.') {
        *pcVar7 = '.';
        goto LAB_0012e4e4;
      }
      cVar3 = pcVar10[2];
      if (cVar3 == '>') break;
      bVar1 = false;
      bVar12 = true;
    } while (cVar3 != '\0');
    pcVar6 = pcVar7;
    if (pcVar7 + -1 != dst) {
      do {
        pcVar7 = pcVar6 + -1;
        pcVar13 = pcVar6 + -2;
        pcVar6 = pcVar7;
      } while (*pcVar13 != '/');
    }
    pcVar6 = pcVar10 + 3;
    if (cVar3 == '\0') {
      pcVar6 = pcVar10 + 2;
    }
  } while( true );
}

Assistant:

int unixpathname(char *src, char *dst, int versionp, int genp)
#endif /* DOS */
{
  char *cp, *dp, *np;
  int newdirflg;
  char name[64];
  char lfname[MAXPATHLEN], fbuf1[MAXPATHLEN], fbuf2[MAXPATHLEN];
  char ver1[VERSIONLEN], ver2[VERSIONLEN];
  struct passwd *pwd;

#ifdef DOS
  char *rp;
  int namelen = 0, extlen = 0; /* lengths of name & extension */
  int extensionp = 0;          /* T if we're in the extension */
  int version = 1;             /* version # for this file */
#endif                         /* DOS */

/* If there's a drive letter, it and a colon come first */
#ifdef DOS
  if (drive && (*drive)) {
    *dst++ = *drive;
    *dst++ = DRIVESEP;
  }
#endif /* DOS */

  /*
   * The UNIX root directory is represented as "<" in Xerox Lisp generic
   * file system code.
   */
  if (strcmp(src, "<") == 0) {
    strcpy(dst, DIRSEPSTR);
    return (1);
  }

  /* Copy src to protect it from destructive modification. */
  strcpy(lfname, src);

/*
 * If versionp is specified, we have to deal with the version field first,
 * because the quotation mark which quotes the semicolon might be lost
 * in the course of the following conversion.
 */
#ifdef DOS
  if (versionp) LispVersionToUnixVersion(lfname, version); else version = -1;
#else
  if (versionp) LispVersionToUnixVersion(lfname);
#endif /* DOS */

  cp = lfname;
  dp = dst;

  /*
   * We have to deal with the case in which the pathname is started with
   * the meta character ('.', '~').
   */

  switch (*cp) {
    case '.':
      switch (*(cp + 1)) {
        case '.':
          if (*(cp + 2) == '>' || *(cp + 2) == '\0') {
            /*
             * "..>" or ".." means the parent directory of the
             * user's current working directory.
             */
            if (getcwd(dst, MAXPATHLEN) == 0) return (0);
#ifdef DOS
            dp = max(strrchr(dst, '/'), strrchr(dst, DIRSEP));
#else
            dp = strrchr(dst, '/');
#endif /* DOS */

            dp++;
            if (*(cp + 2) == '\0')
              cp += 2;
            else
              cp += 3;
          } else {
            /* Insert the initial directory delimiter. */
            *dp++ = DIRSEP;
          }
          break;
#ifdef DOS
        case '/':
        case DIRSEP:
#endif
        case '>':
          /* ".>" means the user's current working directory. */
          if (getcwd(dst, MAXPATHLEN) == 0) return (0);
          while (*dp != '\0') dp++;

          *dp++ = DIRSEP;
          cp += 2;
          break;

        case '\0':
          /* "." also means the user's current working directory. */
          if (getcwd(dst, MAXPATHLEN) == 0) return (0);
          while (*dp != '\0') dp++;

          *dp++ = DIRSEP;
          cp++;
          break;

        default:
          /* Insert the initial directory delimiter. */
          *dp++ = DIRSEP;
          break;
      }
      break;
#ifndef DOS
    case '~':
      if (*(cp + 1) == '>' || *(cp + 1) == '\0') {
        /* "~>" or "~" means the user's home directory. */
        TIMEOUT0(pwd = getpwuid(getuid()));
        if (pwd == NULL) return (0);

        strcpy(dst, pwd->pw_dir);
        while (*dp != '\0') dp++;
        if (*(dp - 1) != DIRSEP) {
          /*
           * Usually system administrators specify the users'
           * home directories in the /etc/passwd without
           * the trail directory delimiter.
           */
          *dp++ = DIRSEP;
        }
        if (*(cp + 1) == '\0')
          cp++;
        else
          cp += 2;
      } else {
        /*
         * In this case, we assume some user's home directory
         * is specified in the form "~username".
         */
        for (++cp, np = name; *cp != '\0' && *cp != '>';) *np++ = *cp++;
        *np = '\0';
        TIMEOUT0(pwd = getpwnam(name));
        if (pwd == NULL) return (0);

        strcpy(dst, pwd->pw_dir);
        while (*dp != '\0') dp++;
        if (*(dp - 1) != DIRSEP) {
          /*
           * Usually system administrators specify the users'
           * home directories in the /etc/passwd without
           * the trail directory delimiter.
           */
          *dp++ = DIRSEP;
        }

        if (*cp == '>') cp++;
      }
      break;

#else
    /* For DOS, ignore ~> or ~/ or ~ */
    case '~':
      if (*(cp + 1) == '>' || *(cp + 1) == '\0') {
        /* "~>" or "~" means the user's home directory. */

        *dp++ = DIRSEP;
        if (*(cp + 1) == '\0')
          cp++;
        else
          cp += 2;
      } else {
        /*
         * In this case, we assume some user's home directory
         * is specified in the form "~username".
         */
        for (++cp, np = name; *cp != '\0' && *cp != '>';) *np++ = *cp++;
        *dp++ = DIRSEP;

        if (*cp == '>') cp++;
      }
      break;

#endif /* DOS */
    default:
      *dp++ = '/'; /* Insert the initial directory delimiter. */
      break;
  }

  /*
   * At this point, cp is placed at the point from which the source pathname
   * will be scanned, and dp is placed at the point on dst from which the
   * pathname will be copied.
   */

  newdirflg = 1;
  while (*cp != '\0') {
    if (newdirflg) {
      /*
       * The new directory component starts.  We have to care about
       * the meta characters again.  This time, the tilde character
       * has no special meaning.
       */
      switch (*cp) {
        case '.':
          switch (*(cp + 1)) {
            case '.':
              /* "..>" or ".." */
              if (*(cp + 2) == '>' || *(cp + 2) == '\0') {
                /*
                 * We have to check if we have already
                 * backed to the root directory or not.
                 */
                if ((dp - 1) != dst) {
                  /*
                   * We are not at the root
                   * directory.  Back to the
                   * parent directory.
                   */
                  for (dp -= 2; *dp != '/'; dp--) {}
                  dp++;
                }
                if (*(cp + 2) == '\0')
                  cp += 2;
                else
                  cp += 3;
              } else {
                /*
                 * (IL:DIRECTORY "{DSK}.") is translated
                 * as (IL:DIRECTORY "{DSK}~>.;*").
                 * The Lisp directory is translated as
                 * like "/users/akina/..~*~" by
                 * unixpathname.   Although such
                 * file name representation makes no sense,
                 * to avoid infinite loop, skip the
                 * first period here, as well as down
                 * a newdirflg.
                 */
                cp++;
                newdirflg = 0;
              }
              break;

            case '>':
              /* ".>" */
              cp += 2;
              break;

            case '\0':
              /* "." */
              cp++;
              break;

            default:
              *dp++ = *cp++;
              newdirflg = 0;
              break;
          }
          break;

        case '\'':
          /*
           * The first character of the new directory component
           * is a quotation mark which is the quote character
           * in the Xerox Lisp file naming convention.  Copy the
           * next character and skip the quoted character.
           */
          *dp++ = *(cp + 1);
          cp += 2;
          newdirflg = 0;
          break;

        default:
          *dp++ = *cp++;
          newdirflg = 0;
          break;
      }
    } else {
      switch (*cp) {
#ifdef DOS
        case '/': /* in DOS, must xlate / also. */
#endif            /* DOS */
        case '>':
          /*
           * Xerox Lisp directory delimiter '>' is translated into
           * UNIX one, '/'.
           */
          *dp = DIRSEP;
          dp++;
          cp++;
          newdirflg = 1; /* Turn on the new directory flag. */
#ifdef DOS
          namelen = extlen = 0;
          rp = dp; /* remember where raw filename starts */
#endif             /* DOS */
          break;

        case '\'':
/*
 * The special characters in the Xerox Lisp file naming
 * convention are quoted with the quote character.
 * They are all valid in the UNIX file naming convention.
 * So only we have to do is to skip the quotation mark
 * and copy the next character.
 */
#ifdef DOS
          if (NameValid) *dp++ = *(cp + 1);
          CountNameChars;
#endif /* DOS */
          cp += 2;
          break;
#ifdef DOS
        case '.': /* start of extension, if not already */
          if (!extensionp)
            *dp++ = *cp++;
          else
            cp++;
          extensionp = 1;
          break;
#endif /* DOS */
        default:
          if (NameValid)
            *dp++ = *cp++;
          else
            cp++;
          CountNameChars;
          break;
      }
    }
  }
  *dp = '\0';
  if (!newdirflg && !genp) {
    /*
     * If the last character in dst is a period, it has to be handled
     * specially, because it might be used to specify that src has no
     * extension field.  This case can be distinguished by examining the
     * character just before the period.
     * If the specified pathname is one like "~>..", the last meta character
     * matches this case.  Thus we check newdirflg first so as not to be
     * confused by this case.
     *
     * Only case in which genp is 1 is unixpathname is used to convert
     * a pattern which is used to enumerate directory.  In this case,
     * for the convenience of the pattern matching routines, we don't
     * care about the last period character.
     */
    strcpy(fbuf1, lfname);
    strcpy(fbuf2, dst);
    separate_version(fbuf1, ver1, 1);
    separate_version(fbuf2, ver2, 1);
    for (cp = fbuf1; *cp; cp++) {}
    for (dp = fbuf2; *dp; dp++) {}
    if (*(cp - 1) == '.') {
      if (*(cp - 2) != '\'' || ((cp - 3) > fbuf1 && *(cp - 3) == '\'')) {
        /*
         * The last period is not been quoted.  It is used
         * to specify the no extension case.  We have to
         * omit this period.
         */
        *(dp - 1) = '\0';
      }
    }
#ifdef DOS
    if (version >= 0)
      sprintf(ver2, "%d", version);
    else
      *ver2 = '\0';
#endif /* DOS */
    ConcNameAndVersion(fbuf2, ver2, dst);
  }
  return (1);
}